

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

bool google::FindSymbol(uint64_t pc,int fd,char *out,size_t out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ssize_t sVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  int unaff_EBP;
  ulong uVar10;
  Elf64_Sym buf [32];
  
  uVar8 = 0;
  if (symtab != (Elf64_Shdr *)0x0) {
    uVar2 = symtab->sh_size / symtab->sh_entsize;
    while( true ) {
      bVar9 = (byte)unaff_EBP;
      uVar10 = uVar2 - uVar8;
      if (uVar2 < uVar8 || uVar10 == 0) break;
      if (0x1f < uVar10) {
        uVar10 = 0x20;
      }
      uVar3 = ReadFromOffset(fd,buf,uVar10 * 0x18,symtab->sh_entsize * uVar8 + symtab->sh_offset);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      uVar4 = SUB168(auVar1 / ZEXT816(0x18),0);
      if ((uVar3 % 0x18 != 0) || (uVar10 < uVar4)) {
        abort();
      }
      for (uVar7 = 0; uVar10 = (ulong)uVar7, uVar10 < uVar4; uVar7 = uVar7 + 1) {
        if ((((buf[uVar10].st_value != 0) &&
             (uVar3 = buf[uVar10].st_value + symbol_offset, uVar3 <= pc)) &&
            (buf[uVar10].st_shndx != 0)) && (pc < uVar3 + buf[uVar10].st_size)) {
          sVar5 = ReadFromOffset(fd,out,out_size,(ulong)buf[uVar10].st_name + strtab->sh_offset);
          if (0 < sVar5) {
            pvVar6 = memchr(out,0,out_size);
            bVar9 = 1;
            if (pvVar6 != (void *)0x0) goto LAB_0011cbee;
          }
          bVar9 = 0;
          memset(out,0,out_size);
          goto LAB_0011cbee;
        }
      }
      uVar8 = (ulong)(uint)(SUB164(auVar1 / ZEXT816(0x18),0) + (int)uVar8);
      unaff_EBP = fd;
    }
LAB_0011cbee:
    uVar8 = (ulong)(uVar8 < uVar2 & bVar9);
  }
  return SUB81(uVar8,0);
}

Assistant:

static ATTRIBUTE_NOINLINE bool FindSymbol(uint64_t pc, const int fd, char* out,
                                          size_t out_size,
                                          uint64_t symbol_offset,
                                          const ElfW(Shdr) * strtab,
                                          const ElfW(Shdr) * symtab) {
  if (symtab == nullptr) {
    return false;
  }
  const size_t num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (unsigned i = 0; i < num_symbols;) {
    size_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#    if defined(__WORDSIZE) && __WORDSIZE == 64
    const size_t NUM_SYMBOLS = 32U;
#    else
    const size_t NUM_SYMBOLS = 64U;
#    endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    size_t num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    GLOG_SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_symbols_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    GLOG_SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (unsigned j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == nullptr) {
          memset(out, 0, out_size);
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}